

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

void QuaternionToAxisAngle(Quaternion q,Vector3 *outAxis,float *outAngle)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var [12];
  undefined1 auVar6 [16];
  undefined1 auVar9 [16];
  Quaternion QVar10;
  float local_38;
  undefined8 local_28;
  Quaternion QStack_20;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  
  fVar3 = q.w;
  local_28 = q._0_8_;
  if (ABS(fVar3) <= 1.0) {
    local_38 = q.z;
    QStack_20._0_8_ = q._0_8_;
  }
  else {
    QVar10 = QuaternionNormalize(q);
    fVar3 = QVar10.w;
    local_28 = QVar10._0_8_;
    local_38 = QVar10.z;
    QStack_20._0_8_ = extraout_XMM0_Qb;
  }
  fVar2 = acosf(fVar3);
  fVar3 = 1.0 - fVar3 * fVar3;
  if (fVar3 < 0.0) {
    auVar9._0_4_ = sqrtf(fVar3);
    auVar9._4_12_ = extraout_var;
    uVar5 = auVar9._0_8_;
  }
  else {
    uVar5 = (ulong)(uint)SQRT(fVar3);
  }
  fVar3 = 0.0;
  auVar6._0_4_ = (float)uVar5;
  auVar1._8_4_ = QStack_20.x;
  auVar1._12_4_ = QStack_20.y;
  auVar1._0_8_ = local_28;
  if (0.0001 < auVar6._0_4_) {
    fVar3 = local_38 / auVar6._0_4_;
  }
  uVar8 = (undefined4)(uVar5 >> 0x20);
  auVar7._8_4_ = uVar8;
  auVar7._0_8_ = uVar5;
  auVar7._12_4_ = uVar8;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._4_4_ = auVar6._0_4_;
  auVar9 = divps(auVar1,auVar6);
  uVar4 = (int)((uint)(0.0001 < auVar6._0_4_) << 0x1f) >> 0x1f;
  uVar5 = (ulong)(~uVar4 & 0x3f800000) |
          CONCAT44(auVar9._4_4_ & (int)((uint)(0.0001 < auVar6._0_4_) << 0x1f) >> 0x1f,
                   auVar9._0_4_ & uVar4);
  outAxis->x = (float)(int)uVar5;
  outAxis->y = (float)(int)(uVar5 >> 0x20);
  outAxis->z = fVar3;
  *outAngle = fVar2 + fVar2;
  return;
}

Assistant:

RMDEF void QuaternionToAxisAngle(Quaternion q, Vector3 *outAxis, float *outAngle)
{
    if (fabs(q.w) > 1.0f) q = QuaternionNormalize(q);

    Vector3 resAxis = { 0.0f, 0.0f, 0.0f };
    float resAngle = 2.0f*acosf(q.w);
    float den = sqrtf(1.0f - q.w*q.w);

    if (den > 0.0001f)
    {
        resAxis.x = q.x/den;
        resAxis.y = q.y/den;
        resAxis.z = q.z/den;
    }
    else
    {
        // This occurs when the angle is zero.
        // Not a problem: just set an arbitrary normalized axis.
        resAxis.x = 1.0f;
    }

    *outAxis = resAxis;
    *outAngle = resAngle;
}